

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int CreateMushroomFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  int iVar1;
  double dVar2;
  int value2_local;
  int value1_local;
  VMFunctionBuilder *buildit_local;
  
  VMFunctionBuilder::Emit(buildit,0x39,0,0xff,0);
  VMFunctionBuilder::Emit(buildit,0x39,0,0xff,0);
  VMFunctionBuilder::Emit(buildit,0x3a,1);
  if (value1 == 0) {
    VMFunctionBuilder::Emit(buildit,0x39,0,0xff,0);
  }
  else {
    dVar2 = DEHToDouble(value1);
    iVar1 = VMFunctionBuilder::GetConstantFloat(buildit,dVar2);
    VMFunctionBuilder::Emit(buildit,0x39,0,5,iVar1);
  }
  if (value2 == 0) {
    VMFunctionBuilder::Emit(buildit,0x39,0,0xff,0);
  }
  else {
    dVar2 = DEHToDouble(value2);
    iVar1 = VMFunctionBuilder::GetConstantFloat(buildit,dVar2);
    VMFunctionBuilder::Emit(buildit,0x39,0,5,iVar1);
  }
  return 5;
}

Assistant:

static int CreateMushroomFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_Mushroom
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);		// spawntype
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);		// numspawns
	buildit.Emit(OP_PARAMI, 1);					// flag
	// vrange
	if (value1 == 0)
	{
		buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);
	}
	else
	{
		buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, buildit.GetConstantFloat(DEHToDouble(value1)));
	}
	// hrange
	if (value2 == 0)
	{
		buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);
	}
	else
	{
		buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, buildit.GetConstantFloat(DEHToDouble(value2)));
	}
	return 5;
}